

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall
bal::Formula::add_named_variable(Formula *this,char *name,VariablesArray *value,variableid_t index)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
  local_a8;
  _Self local_70 [3];
  allocator local_51;
  string local_50 [32];
  _Self local_30;
  iterator it;
  variableid_t index_local;
  VariablesArray *value_local;
  char *name_local;
  Formula *this_local;
  
  it._M_node._4_4_ = index;
  value_local = (VariablesArray *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,name,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
       ::find(&this->named_variables_,(key_type *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
       ::end(&this->named_variables_);
  bVar1 = std::operator==(&local_30,local_70);
  if (bVar1) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
    ::pair<const_char_*const_&,_true>(&local_a8,(char **)&value_local,value);
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
    ::insert(&this->named_variables_,&local_a8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
    ::~pair(&local_a8);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
             ::operator->(&local_30);
    VariablesArray::expand_elements(&ppVar2->second,it._M_node._4_4_ + 1);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
             ::operator->(&local_30);
    VariablesArray::assign_element(&ppVar2->second,value,it._M_node._4_4_);
  }
  return;
}

Assistant:

void Formula::add_named_variable(const char* const name, const VariablesArray& value, const variableid_t index) {
        auto it = named_variables_.find(name);
        if (it == named_variables_.end()) {
            named_variables_.insert({name, value});
        } else {
            it->second.expand_elements(index + 1);
            it->second.assign_element(value, index);
        };
    }